

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool url_match_result(_Bool result,void *userdata)

{
  connectdata *conn;
  Curl_easy *data;
  ulong uVar1;
  curl_trc_feat *pcVar2;
  byte bVar3;
  
  conn = *userdata;
  if (conn == (connectdata *)0x0) {
    bVar3 = *(byte *)((long)userdata + 0x18);
    if ((bVar3 & 0xc0) == 0x40) {
      bVar3 = bVar3 & 0x77;
    }
    else if ((bVar3 & 0x20) != 0) {
      data = *(Curl_easy **)((long)userdata + 8);
      uVar1 = *(ulong *)&(data->set).field_0x894;
      if ((uVar1 >> 0x2c & 1) != 0) {
        if ((((uint)uVar1 >> 0x1e & 1) != 0) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
          bVar3 = *(byte *)((long)userdata + 0x18);
        }
        bVar3 = bVar3 | 8;
      }
    }
    *(byte *)((long)userdata + 0x18) = bVar3 & 0xef;
  }
  else {
    Curl_attach_connection(*(Curl_easy **)((long)userdata + 8),conn);
  }
  return conn != (connectdata *)0x0;
}

Assistant:

static bool url_match_result(bool result, void *userdata)
{
  struct url_conn_match *match = userdata;
  (void)result;
  if(match->found) {
    /* Attach it now while still under lock, so the connection does
     * no longer appear idle and can be reaped. */
    Curl_attach_connection(match->data, match->found);
    return TRUE;
  }
  else if(match->seen_single_use_conn && !match->seen_multiplex_conn) {
    /* We've seen a single-use, existing connection to the destination and
     * no multiplexed one. It seems safe to assume that the server does
     * not support multiplexing. */
    match->wait_pipe = FALSE;
  }
  else if(match->seen_pending_conn && match->data->set.pipewait) {
    infof(match->data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
    match->wait_pipe = TRUE;
  }
  match->force_reuse = FALSE;
  return FALSE;
}